

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void generate_c_code(ParsedOpcodeInfo *info,CCVariant *var,int m68kop,int synop,SymbolTable *sym,
                    char *operand_decls,char *postcode,OpcodeMappingInfo *map)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  List *pLVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int local_6c;
  int i;
  List *code;
  char local_58 [4];
  int opcw;
  char buf4 [17];
  char local_3c [2];
  char buf3 [6];
  char buf2 [6];
  char buf1 [6];
  char *operand_decls_local;
  SymbolTable *sym_local;
  int synop_local;
  int m68kop_local;
  CCVariant *var_local;
  ParsedOpcodeInfo *info_local;
  
  pLVar4 = copy_list(var->code);
  c_postamble[0] = '\0';
  c_preamble[0] = '\0';
  pLVar4 = replace_dollar_elements(pLVar4,m68kop,info,var);
  pLVar4 = reduce(pLVar4,sym,0);
  pFVar2 = syn68k_c_stream;
  pcVar1 = info->name;
  pcVar5 = opcode_bits_string(m68kop,info,var,local_58);
  pcVar6 = cc_bits_string(*(uint *)var & 0x1f,buf3 + 4);
  pcVar7 = cc_bits_string(*(uint *)var >> 5 & 0x1f,local_3c);
  pcVar8 = cc_bits_string(*(uint *)var >> 10 & 0x1f,buf4 + 0xe);
  fprintf((FILE *)pFVar2,"\n      /* %s %s ms:%s mns:%s needs:%s */\n",pcVar1,pcVar5,pcVar6,pcVar7,
          pcVar8);
  fprintf((FILE *)syn68k_c_stream,"      CASE (0x%04X)\n",(ulong)(uint)synop);
  pFVar2 = syn68k_c_stream;
  pcVar1 = info->name;
  pcVar5 = opcode_bits_string(m68kop,info,var,local_58);
  pcVar6 = cc_bits_string(*(uint *)var & 0x1f,buf3 + 4);
  pcVar7 = cc_bits_string(*(uint *)var >> 5 & 0x1f,local_3c);
  pcVar8 = cc_bits_string(*(uint *)var >> 10 & 0x1f,buf4 + 0xe);
  fprintf((FILE *)pFVar2,"        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", \"%s\", \"%s\")\n",pcVar1,
          pcVar5,pcVar6,pcVar7,pcVar8);
  fputs(operand_decls,(FILE *)syn68k_c_stream);
  transform_reg_to_var_and_decl(pLVar4);
  generate_temp_decls(pLVar4);
  if ((pLVar4->token).type == TOK_LIST) {
    if (c_preamble[0] != '\0') {
      fprintf((FILE *)syn68k_c_stream,"        %s\n",c_preamble);
    }
    fputs("        ",(FILE *)syn68k_c_stream);
    generate_code_for_list(pLVar4,m68kop,info,var);
    fputs(";\n",(FILE *)syn68k_c_stream);
    if (c_postamble[0] != '\0') {
      fprintf((FILE *)syn68k_c_stream,"        %s\n",c_postamble);
    }
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      if (((int)(*(uint *)var >> 0xf & 0x1f) >> (4U - (char)local_6c & 0x1f) & 1U) != 0) {
        fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",generate_c_code::cc_name + local_6c,
                (ulong)((int)(*(uint *)var >> 0x14 & 0x1f) >> (4U - (char)local_6c & 0x1f) & 1));
      }
    }
    if ((*(uint *)var >> 0xf & 1) != 0) {
      fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",0x11af70,
              (ulong)(((*(uint *)var >> 0x14 & 1) != 0 ^ 0xffU) & 1));
    }
    if ((postcode != (char *)0x0) && (*postcode != '\0')) {
      fprintf((FILE *)syn68k_c_stream,"        %s\n",postcode);
    }
    iVar3 = synthetic_opcode_size(map);
    if (info->ends_block == FALSE) {
      fprintf((FILE *)syn68k_c_stream,"        CASE_POSTAMBLE (ROUND_UP (%d))\n",
              (ulong)(uint)(iVar3 + info->operand_words_to_skip));
    }
    else {
      fputs("\n#ifdef PROFILE\n       profile_block (hash_lookup (READUL_US ((unsigned long)code - 4)));\n#endif\n"
            ,(FILE *)syn68k_c_stream);
      fprintf((FILE *)syn68k_c_stream,
              "#if SIZEOF_CHAR_P != 8\n\t    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n#else\n\t    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n#endif\n"
             );
      fprintf((FILE *)syn68k_c_stream,"        CASE_POSTAMBLE (ROUND_UP (PTR_WORDS))\n");
    }
  }
  else {
    parse_error(pLVar4,"Expecting code description list!\n");
  }
  return;
}

Assistant:

void
generate_c_code (const ParsedOpcodeInfo *info, const CCVariant *var,
		 int m68kop, int synop, SymbolTable *sym,
		 const char *operand_decls, const char *postcode,
		 const OpcodeMappingInfo *map)
{
  static const char cc_name[][16] = { "cpu_state.ccc", "cpu_state.ccn",
					"cpu_state.ccv", "cpu_state.ccx",
					"cpu_state.ccnz" };
  char buf1[6], buf2[6], buf3[6], buf4[17];
  int opcw;
  List *code = copy_list (var->code);
  int i;

  /* Clear out preamble and postamble. */
  c_preamble[0] = c_postamble[0] = '\0';

  /* Replace $ elements with appropriate things. */
  code = replace_dollar_elements (code, m68kop, info, var);

  /* Simplify the resulting code. */
  code = reduce (code, sym, 0);

  /* Output human-readable comment describing this synthetic opcode. */
  fprintf (syn68k_c_stream,
	   "\n      /* %s %s ms:%s mns:%s needs:%s */\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output case. */
  fprintf (syn68k_c_stream, "      CASE (0x%04X)\n", (unsigned) synop);
  fprintf (syn68k_c_stream, "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", "
	   "\"%s\", \"%s\")\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output operand declarations. */
  fputs (operand_decls, syn68k_c_stream);

  /* Transform temp variables only used as one type to temp_variables,
   * and output decls for those variables.
   */
  transform_reg_to_var_and_decl (code);

  /* Output temp variable declarations. */
  generate_temp_decls (code);

  if (code->token.type != TOK_LIST)
    {
      parse_error (code, "Expecting code description list!\n");
      return;
    }

  /* Output preamble. */
  if (c_preamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_preamble);
  
  /* Generate the code they specified. */
  fputs ("        ", syn68k_c_stream);
  generate_code_for_list (code, m68kop, info, var);
  fputs (";\n", syn68k_c_stream);
  
  /* Output postamble. */
  if (c_postamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_postamble);
  
  /* Set any cc bits to 0 or 1 that are explicitly mentioned in the
   * cc variant description.  This saves the user some work generating
   * the 68k description file and reduces the chance of error.
   */
  for (i = 0; i < 4; i++)
    if ((var->cc_to_known_value >> (4 - i)) & 1)
      fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[i],
	       (var->cc_known_values >> (4 - i)) & 1);
  if (var->cc_to_known_value & 1)   /* Invert sense of Z bit. */
    fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[4],
	     !(var->cc_known_values & 1));

  if (postcode != NULL && postcode[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", postcode);

  /* Count opcode words. */
  opcw = synthetic_opcode_size (map) + info->operand_words_to_skip;

  /* Only adjust code ptr if we didn't just end a block. */
  if (!info->ends_block)
    {
      /* Always increment enough so that the next opcode is guaranteed
       * to be a properly aligned pointer.
       */
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE (ROUND_UP (%d))\n",
	       (int) opcw);
    }

  else    /* If we end a block, profile the next block. */
    {
#if SIZEOF_CHAR_P != 8
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL (US_TO_SYN68K (code) - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#else
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL_US ((unsigned long)code - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#endif

#if defined (SYNCHRONOUS_INTERRUPTS) && !defined (GENERATE_NATIVE_CODE)
      fprintf (syn68k_c_stream,
"#if SIZEOF_CHAR_P != 8\n"
"	    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n"
"#else\n"
"	    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n"
"#endif\n");
#endif
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE "
	       "(ROUND_UP (PTR_WORDS))\n");
    }
  /* Done with this instruction. */
}